

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptorTables::AddFieldByStylizedNames
          (FileDescriptorTables *this,FieldDescriptor *field)

{
  long lVar1;
  void *pvVar2;
  PointerStringPair camelcase_key;
  PointerStringPair lowercase_key;
  first_type local_38;
  first_type local_28;
  
  lVar1 = 0x58;
  if (field[0x50] == (FieldDescriptor)0x1) {
    pvVar2 = *(void **)(field + 0x68);
    if (pvVar2 != (void *)0x0) goto LAB_002d405e;
    lVar1 = 0x30;
  }
  pvVar2 = *(void **)(field + lVar1);
LAB_002d405e:
  local_28.second = (char *)**(undefined8 **)(field + 0x10);
  local_28.first = pvVar2;
  InsertIfNotPresent<google::protobuf::hash_map<std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual,std::allocator<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::FieldDescriptor_const*>>>>
            (&this->fields_by_lowercase_name_,&local_28,(second_type *)field);
  local_38.second = (char *)**(undefined8 **)(field + 0x18);
  local_38.first = pvVar2;
  InsertIfNotPresent<google::protobuf::hash_map<std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual,std::allocator<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::FieldDescriptor_const*>>>>
            (&this->fields_by_camelcase_name_,&local_38,(second_type *)field);
  return;
}

Assistant:

void FileDescriptorTables::AddFieldByStylizedNames(
    const FieldDescriptor* field) {
  const void* parent;
  if (field->is_extension()) {
    if (field->extension_scope() == NULL) {
      parent = field->file();
    } else {
      parent = field->extension_scope();
    }
  } else {
    parent = field->containing_type();
  }

  PointerStringPair lowercase_key(parent, field->lowercase_name().c_str());
  InsertIfNotPresent(&fields_by_lowercase_name_, lowercase_key, field);

  PointerStringPair camelcase_key(parent, field->camelcase_name().c_str());
  InsertIfNotPresent(&fields_by_camelcase_name_, camelcase_key, field);
}